

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringCacheTest.cpp
# Opt level: O3

void __thiscall
TEST_SimpleStringInternalCache_clearAllIncludingCurrentlyUsedMemoryAlsoReleasesLargeNonCachesMemory_Test
::
~TEST_SimpleStringInternalCache_clearAllIncludingCurrentlyUsedMemoryAlsoReleasesLargeNonCachesMemory_Test
          (TEST_SimpleStringInternalCache_clearAllIncludingCurrentlyUsedMemoryAlsoReleasesLargeNonCachesMemory_Test
           *this)

{
  (this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupSimpleStringInternalCache_00370b70;
  TestTestingFixture::~TestTestingFixture
            (&(this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).fixture);
  ExecFunctionWithoutParameters::~ExecFunctionWithoutParameters
            ((ExecFunctionWithoutParameters *)
             &(this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).testFunction);
  MemoryAccountant::~MemoryAccountant
            (&(this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).accountant);
  SimpleStringInternalCache::~SimpleStringInternalCache
            (&(this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).cache);
  Utest::~Utest((Utest *)this);
  operator_delete(this,0xa0);
  return;
}

Assistant:

TEST(SimpleStringInternalCache, clearAllIncludingCurrentlyUsedMemoryAlsoReleasesLargeNonCachesMemory)
{
    cache.setAllocator(allocator);

    cache.alloc(1234);
    cache.alloc(1234);
    cache.alloc(1234);

    cache.clearAllIncludingCurrentlyUsedMemory();

    LONGS_EQUAL(3, accountant.totalAllocationsOfSize(1234));
    LONGS_EQUAL(3, accountant.totalDeallocationsOfSize(1234));
}